

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  uint uVar1;
  uint in_EAX;
  int iVar2;
  long lVar3;
  double dVar4;
  
  if ((pMem->flags & 0xd) == 0) {
    iVar2 = sqlite3Atoi64(pMem->z,&(pMem->u).i,pMem->n,pMem->enc);
    if (iVar2 == 0) {
      uVar1._0_2_ = pMem->flags;
      uVar1._2_1_ = pMem->type;
      uVar1._3_1_ = pMem->enc;
      in_EAX = uVar1 & 0xffffbe00 | 4;
    }
    else {
      dVar4 = sqlite3VdbeRealValue(pMem);
      pMem->r = dVar4;
      in_EAX = pMem->flags & 0xbe00;
      pMem->flags = (short)in_EAX + 8;
      lVar3 = (long)dVar4;
      if (9.223372036854776e+18 < ABS(dVar4)) {
        lVar3 = -0x8000000000000000;
      }
      (pMem->u).i = lVar3;
      if (((dVar4 != (double)lVar3) || (NAN(dVar4) || NAN((double)lVar3))) ||
         (lVar3 + 0x8000000000000001U < 2)) goto LAB_0016af1b;
      in_EAX = in_EAX | 0xc;
    }
    pMem->flags = (u16)in_EAX;
  }
LAB_0016af1b:
  *(byte *)&pMem->flags = (byte)pMem->flags & 0xed;
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob);
  return SQLITE_OK;
}